

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

bool __thiscall cmLocalGenerator::CheckDefinition(cmLocalGenerator *this,string *define)

{
  long lVar1;
  ostream *poVar2;
  ostringstream e;
  string local_1a8;
  undefined1 local_188 [376];
  
  lVar1 = std::__cxx11::string::find_first_of((char *)define,0x53b4c9,0);
  if ((lVar1 == -1) || ((define->_M_dataplus)._M_p[lVar1] != '(')) {
    lVar1 = std::__cxx11::string::find((char)define,0x23);
    if (lVar1 == -1) {
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"WARNING: Preprocessor definitions containing \'#\' may not be "
               ,0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"passed on the compiler command line because many compilers ",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"do not support it.\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"CMake is dropping a preprocessor definition: ",0x2d);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_188,(define->_M_dataplus)._M_p,define->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Consider defining the macro in a (configured) header file.\n",0x3b);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message(&local_1a8,(char *)0x0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"WARNING: Function-style preprocessor definitions may not be ",
               0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"passed on the compiler command line because many compilers ",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"do not support it.\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"CMake is dropping a preprocessor definition: ",0x2d);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_188,(define->_M_dataplus)._M_p,define->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Consider defining the macro in a (configured) header file.\n",0x3b);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message(&local_1a8,(char *)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  std::ios_base::~ios_base((ios_base *)(local_188 + 0x70));
  return false;
}

Assistant:

bool cmLocalGenerator::CheckDefinition(std::string const& define) const
{
  // Many compilers do not support -DNAME(arg)=sdf so we disable it.
  std::string::size_type pos = define.find_first_of("(=");
  if (pos != std::string::npos) {
    if (define[pos] == '(') {
      std::ostringstream e;
      /* clang-format off */
      e << "WARNING: Function-style preprocessor definitions may not be "
        << "passed on the compiler command line because many compilers "
        << "do not support it.\n"
        << "CMake is dropping a preprocessor definition: " << define << "\n"
        << "Consider defining the macro in a (configured) header file.\n";
      /* clang-format on */
      cmSystemTools::Message(e.str());
      return false;
    }
  }

  // Many compilers do not support # in the value so we disable it.
  if (define.find_first_of('#') != std::string::npos) {
    std::ostringstream e;
    /* clang-format off */
    e << "WARNING: Preprocessor definitions containing '#' may not be "
      << "passed on the compiler command line because many compilers "
      << "do not support it.\n"
      << "CMake is dropping a preprocessor definition: " << define << "\n"
      << "Consider defining the macro in a (configured) header file.\n";
    /* clang-format on */
    cmSystemTools::Message(e.str());
    return false;
  }

  // Assume it is supported.
  return true;
}